

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderPassBase<Diligent::EngineVkImplTraits>::ReserveSpace
          (RenderPassBase<Diligent::EngineVkImplTraits> *this,RenderPassDesc *Desc,
          FixedLinearAllocator *MemPool)

{
  SubpassDesc *pSVar1;
  SubpassDesc *SrcSubpass;
  Uint32 subpass;
  FixedLinearAllocator *MemPool_local;
  RenderPassDesc *Desc_local;
  RenderPassBase<Diligent::EngineVkImplTraits> *this_local;
  
  FixedLinearAllocator::AddSpace<Diligent::RESOURCE_STATE>
            (MemPool,(ulong)Desc->AttachmentCount * (ulong)Desc->SubpassCount);
  FixedLinearAllocator::AddSpace<std::pair<unsigned_int,unsigned_int>>
            (MemPool,(ulong)Desc->AttachmentCount);
  FixedLinearAllocator::AddSpace<Diligent::RenderPassAttachmentDesc>
            (MemPool,(ulong)Desc->AttachmentCount);
  FixedLinearAllocator::AddSpace<Diligent::SubpassDesc>(MemPool,(ulong)Desc->SubpassCount);
  for (SrcSubpass._4_4_ = 0; SrcSubpass._4_4_ < Desc->SubpassCount;
      SrcSubpass._4_4_ = SrcSubpass._4_4_ + 1) {
    pSVar1 = Desc->pSubpasses + SrcSubpass._4_4_;
    FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>
              (MemPool,(ulong)pSVar1->InputAttachmentCount);
    FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>
              (MemPool,(ulong)pSVar1->RenderTargetAttachmentCount);
    if (pSVar1->pResolveAttachments != (AttachmentReference *)0x0) {
      FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>
                (MemPool,(ulong)pSVar1->RenderTargetAttachmentCount);
    }
    if (pSVar1->pDepthStencilAttachment != (AttachmentReference *)0x0) {
      FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>(MemPool,1);
    }
    FixedLinearAllocator::AddSpace<unsigned_int>(MemPool,(ulong)pSVar1->PreserveAttachmentCount);
    if (pSVar1->pShadingRateAttachment != (ShadingRateAttachment *)0x0) {
      FixedLinearAllocator::AddSpace<Diligent::ShadingRateAttachment>(MemPool,1);
    }
  }
  FixedLinearAllocator::AddSpace<Diligent::SubpassDependencyDesc>
            (MemPool,(ulong)Desc->DependencyCount);
  return;
}

Assistant:

void ReserveSpace(const RenderPassDesc& Desc, FixedLinearAllocator& MemPool) const
    {
        MemPool.AddSpace<RESOURCE_STATE>(size_t{Desc.AttachmentCount} * size_t{Desc.SubpassCount}); // m_AttachmentStates
        MemPool.AddSpace<std::pair<Uint32, Uint32>>(Desc.AttachmentCount);                          // m_AttachmentFirstLastUse

        MemPool.AddSpace<RenderPassAttachmentDesc>(Desc.AttachmentCount); // Desc.pAttachments
        MemPool.AddSpace<SubpassDesc>(Desc.SubpassCount);                 // Desc.pSubpasses

        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& SrcSubpass = Desc.pSubpasses[subpass];

            MemPool.AddSpace<AttachmentReference>(SrcSubpass.InputAttachmentCount);        // Subpass.pInputAttachments
            MemPool.AddSpace<AttachmentReference>(SrcSubpass.RenderTargetAttachmentCount); // Subpass.pRenderTargetAttachments

            if (SrcSubpass.pResolveAttachments != nullptr)
                MemPool.AddSpace<AttachmentReference>(SrcSubpass.RenderTargetAttachmentCount); // Subpass.pResolveAttachments

            if (SrcSubpass.pDepthStencilAttachment != nullptr)
                MemPool.AddSpace<AttachmentReference>(1); // Subpass.pDepthStencilAttachment

            MemPool.AddSpace<Uint32>(SrcSubpass.PreserveAttachmentCount); // Subpass.pPreserveAttachments

            if (SrcSubpass.pShadingRateAttachment != nullptr)
                MemPool.AddSpace<ShadingRateAttachment>(1); // Subpass.pShadingRateAttachment
        }

        MemPool.AddSpace<SubpassDependencyDesc>(Desc.DependencyCount); // Desc.pDependencies
    }